

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofSpring2Constraint::get_limit_motor_info2
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float fVar1;
  float fVar2;
  btScalar *pbVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btVector3 *pbVar10;
  int iVar11;
  byte bVar12;
  btVector3 *pbVar13;
  int iVar14;
  ulong uVar15;
  btRotationalLimitMotor2 *pbVar16;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  btScalar bVar22;
  btScalar bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  uVar15 = (long)info->rowskip * (long)row;
  iVar14 = (int)uVar15;
  pbVar16 = limot;
  if (limot->m_currentLimit == 3) {
    calculateJacobi(this,limot,transA,transB,info,iVar14,ax1,rotational,rotAllowed);
    uVar17 = (ulong)iVar14;
    info->m_constraintError[uVar17] =
         (float)(int)(-(uint)(rotational != 0) | 1) *
         info->fps * limot->m_stopERP * limot->m_currentLimitError;
    info->m_lowerLimit[uVar17] = -3.4028235e+38;
    info->m_upperLimit[uVar17] = 3.4028235e+38;
    iVar11 = 1;
  }
  else {
    iVar11 = 0;
    if (limot->m_currentLimit != 4) goto LAB_00194cb8;
    pbVar13 = angVelB;
    pbVar10 = angVelA;
    if (rotational == 0) {
      pbVar13 = linVelB;
      pbVar10 = linVelA;
    }
    fVar25 = (pbVar10->m_floats[2] * ax1->m_floats[2] +
             pbVar10->m_floats[0] * ax1->m_floats[0] + pbVar10->m_floats[1] * ax1->m_floats[1]) -
             (ax1->m_floats[2] * pbVar13->m_floats[2] +
             ax1->m_floats[0] * pbVar13->m_floats[0] + ax1->m_floats[1] * pbVar13->m_floats[1]);
    pbVar16 = (btRotationalLimitMotor2 *)ax1;
    calculateJacobi(this,(btRotationalLimitMotor2 *)ax1,transA,transB,info,iVar14,ax1,rotational,
                    rotAllowed);
    fVar28 = *(float *)(&DAT_001f1a00 + (ulong)(rotational == 0) * 4);
    fVar24 = info->fps * limot->m_stopERP * limot->m_currentLimitError * fVar28;
    pbVar3 = info->m_constraintError;
    pbVar3[uVar15] = fVar24;
    fVar26 = fVar24 - limot->m_stopERP * fVar25;
    if (rotational == 0) {
      bVar23 = 0.0;
      if (0.0 <= fVar26) {
        bVar22 = -3.4028235e+38;
      }
      else {
        fVar26 = -limot->m_bounce * fVar25;
        bVar22 = -3.4028235e+38;
        if (fVar26 < fVar24) goto LAB_00194b48;
      }
    }
    else {
      bVar22 = 0.0;
      if (fVar26 <= 0.0) {
        bVar23 = 3.4028235e+38;
      }
      else {
        fVar26 = -limot->m_bounce * fVar25;
        bVar23 = 3.4028235e+38;
        if (fVar24 < fVar26) {
LAB_00194b48:
          pbVar3[uVar15] = fVar26;
        }
      }
    }
    info->m_lowerLimit[uVar15] = bVar22;
    info->m_upperLimit[uVar15] = bVar23;
    info->cfm[uVar15] = limot->m_stopCFM;
    uVar17 = (long)iVar14 + (long)info->rowskip;
    calculateJacobi(this,pbVar16,transA,transB,info,(int)uVar17,ax1,rotational,rotAllowed);
    fVar28 = fVar28 * info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi;
    pbVar3 = info->m_constraintError;
    pbVar3[uVar17] = fVar28;
    fVar24 = fVar28 - limot->m_stopERP * fVar25;
    if (rotational == 0) {
      bVar23 = 0.0;
      if (0.0 < fVar24) {
        fVar25 = fVar25 * -limot->m_bounce;
        bVar22 = 3.4028235e+38;
        bVar18 = fVar25 < fVar28;
        goto LAB_00194c53;
      }
      bVar22 = 3.4028235e+38;
    }
    else {
      bVar22 = 0.0;
      if (fVar24 < 0.0) {
        fVar25 = fVar25 * -limot->m_bounce;
        bVar23 = -3.4028235e+38;
        bVar22 = 0.0;
        bVar18 = fVar28 < fVar25;
LAB_00194c53:
        if (!bVar18 && fVar28 != fVar25) {
          pbVar3[uVar17] = fVar25;
        }
      }
      else {
        bVar23 = -3.4028235e+38;
      }
    }
    info->m_lowerLimit[uVar17] = bVar23;
    info->m_upperLimit[uVar17] = bVar22;
    iVar11 = 2;
    uVar15 = uVar17 & 0xffffffff;
  }
  info->cfm[uVar17] = limot->m_stopCFM;
  uVar15 = (ulong)(uint)((int)uVar15 + info->rowskip);
LAB_00194cb8:
  iVar14 = (int)uVar15;
  bVar12 = limot->m_enableMotor;
  if (((bool)bVar12 == true) && (limot->m_servoMotor == false)) {
    calculateJacobi(this,pbVar16,transA,transB,info,iVar14,ax1,rotational,rotAllowed);
    bVar23 = limot->m_targetVelocity;
    if (rotational == 0) {
      bVar23 = -bVar23;
    }
    bVar23 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit,
                        limot->m_hiLimit,bVar23,info->fps * limot->m_motorERP);
    info->m_constraintError[iVar14] = bVar23 * limot->m_targetVelocity;
    info->m_lowerLimit[iVar14] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar14] = limot->m_maxMotorForce;
    info->cfm[iVar14] = limot->m_motorCFM;
    iVar14 = iVar14 + info->rowskip;
    iVar11 = iVar11 + 1;
    bVar12 = limot->m_enableMotor;
  }
  if (((bVar12 & 1) != 0) && (limot->m_servoMotor == true)) {
    fVar28 = limot->m_currentPosition - limot->m_servoTarget;
    calculateJacobi(this,pbVar16,transA,transB,info,iVar14,ax1,rotational,rotAllowed);
    fVar24 = 0.0;
    fVar26 = (float)(~-(uint)(fVar28 < 0.0) & (uint)limot->m_targetVelocity |
                    (uint)-limot->m_targetVelocity & -(uint)(fVar28 < 0.0));
    if ((fVar28 != 0.0) || (NAN(fVar28))) {
      fVar24 = limot->m_loLimit;
      fVar25 = limot->m_hiLimit;
      if (fVar24 <= fVar25) {
        if ((fVar28 <= 0.0) || (bVar23 = limot->m_servoTarget, limot->m_servoTarget <= fVar24)) {
          bVar23 = fVar24;
        }
        if ((fVar28 < 0.0) && (limot->m_servoTarget < fVar25)) {
          fVar25 = limot->m_servoTarget;
        }
      }
      else {
        if (fVar28 <= 0.0) {
          bVar23 = -3.4028235e+38;
        }
        else {
          bVar23 = limot->m_servoTarget;
        }
        if (0.0 <= fVar28) {
          fVar25 = 3.4028235e+38;
        }
        else {
          fVar25 = limot->m_servoTarget;
        }
      }
      fVar24 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,limot->m_currentPosition,bVar23,fVar25,
                          -fVar26,info->fps * limot->m_motorERP);
    }
    info->m_constraintError[iVar14] = (float)(int)(-(uint)(rotational != 0) | 1) * fVar26 * fVar24;
    info->m_lowerLimit[iVar14] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar14] = limot->m_maxMotorForce;
    info->cfm[iVar14] = limot->m_motorCFM;
    iVar14 = iVar14 + info->rowskip;
    iVar11 = iVar11 + 1;
  }
  if (limot->m_enableSpring == true) {
    fVar28 = limot->m_currentPosition;
    fVar24 = limot->m_equilibriumPoint;
    calculateJacobi(this,pbVar16,transA,transB,info,iVar14,ax1,rotational,rotAllowed);
    fVar29 = 1.0 / info->fps;
    fVar26 = limot->m_springStiffness;
    fVar25 = limot->m_springDamping;
    if (rotational == 0) {
      angVelA = linVelA;
      angVelB = linVelB;
    }
    fVar4 = ax1->m_floats[0];
    fVar5 = ax1->m_floats[1];
    fVar6 = ax1->m_floats[2];
    fVar7 = angVelA->m_floats[0];
    fVar8 = angVelA->m_floats[1];
    fVar9 = angVelA->m_floats[2];
    fVar30 = angVelB->m_floats[0];
    fVar1 = angVelB->m_floats[1];
    fVar2 = angVelB->m_floats[2];
    auVar21._4_4_ = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
    auVar21._0_4_ = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
    auVar21._8_8_ = 0;
    auVar21 = divps(_DAT_001ee3f0,auVar21);
    fVar27 = auVar21._4_4_;
    if (auVar21._0_4_ <= auVar21._4_4_) {
      fVar27 = auVar21._0_4_;
    }
    fVar20 = fVar26 / fVar27;
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    if (limot->m_springStiffnessLimited != false) {
      uVar19 = -(uint)(0.25 < fVar20 * fVar29);
      fVar26 = (float)(~uVar19 & (uint)fVar26 |
                      (uint)(((1.0 / fVar29) / fVar29) * 0.0625 * fVar27) & uVar19);
    }
    fVar30 = (fVar6 * fVar9 + fVar4 * fVar7 + fVar8 * fVar5) -
             (fVar6 * fVar2 + fVar4 * fVar30 + fVar1 * fVar5);
    if (limot->m_springDampingLimited != false) {
      uVar19 = -(uint)(fVar27 < fVar25 * fVar29);
      fVar25 = (float)(~uVar19 & (uint)fVar25 | (uint)(fVar27 / fVar29) & uVar19);
    }
    fVar25 = -fVar25 * fVar30 * *(float *)(&DAT_001f1a00 + (ulong)(rotational == 0) * 4) * fVar29;
    fVar28 = (fVar28 - fVar24) * fVar26 * fVar29 + fVar25;
    info->m_constraintError[iVar14] =
         *(float *)(&DAT_001f1a00 + (ulong)(rotational == 0) * 4) * fVar28 + fVar30;
    fVar24 = fVar25;
    if (fVar25 <= fVar28) {
      fVar24 = fVar28;
      fVar28 = fVar25;
    }
    if (rotational == 0) {
      fVar26 = 0.0;
      if (fVar28 <= 0.0) {
        fVar26 = fVar28;
      }
      info->m_lowerLimit[iVar14] = fVar26;
    }
    else {
      fVar26 = 0.0;
      if (-fVar24 <= 0.0) {
        fVar26 = -fVar24;
      }
      info->m_lowerLimit[iVar14] = fVar26;
      fVar24 = -fVar28;
    }
    fVar28 = 0.0;
    if (0.0 <= fVar24) {
      fVar28 = fVar24;
    }
    info->m_upperLimit[iVar14] = fVar28;
    info->cfm[iVar14] = 0.0;
    iVar11 = iVar11 + 1;
  }
  return iVar11;
}

Assistant:

int btGeneric6DofSpring2Constraint::get_limit_motor_info2(
	btRotationalLimitMotor2 * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
	int count = 0;
	int srow = row * info->rowskip;

	if (limot->m_currentLimit==4) 
	{
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? 0 : -SIMD_INFINITY;
		info->m_upperLimit[srow] = rotational ? SIMD_INFINITY : 0;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? -SIMD_INFINITY : 0;
		info->m_upperLimit[srow] = rotational ? 0 : SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	} else
	if (limot->m_currentLimit==3) 
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -SIMD_INFINITY;
		info->m_upperLimit[srow] = SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && !limot->m_servoMotor)
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;
		btScalar mot_fact = getMotorFactor(limot->m_currentPosition, 
			limot->m_loLimit,
			limot->m_hiLimit,
			tag_vel,
			info->fps * limot->m_motorERP);
		info->m_constraintError[srow] = mot_fact * limot->m_targetVelocity;
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && limot->m_servoMotor)
	{
		btScalar error = limot->m_currentPosition - limot->m_servoTarget;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar targetvelocity = error<0 ? -limot->m_targetVelocity : limot->m_targetVelocity;
		btScalar tag_vel = -targetvelocity;
		btScalar mot_fact;
		if(error != 0)
		{
			btScalar lowLimit;
			btScalar hiLimit;
			if(limot->m_loLimit > limot->m_hiLimit)
			{
				lowLimit = error > 0 ? limot->m_servoTarget : -SIMD_INFINITY;
				hiLimit  = error < 0 ? limot->m_servoTarget :  SIMD_INFINITY;
			}
			else
			{
				lowLimit = error > 0 && limot->m_servoTarget>limot->m_loLimit ? limot->m_servoTarget : limot->m_loLimit;
				hiLimit  = error < 0 && limot->m_servoTarget<limot->m_hiLimit ? limot->m_servoTarget : limot->m_hiLimit;
			}
			mot_fact = getMotorFactor(limot->m_currentPosition, lowLimit, hiLimit, tag_vel, info->fps * limot->m_motorERP);
		} 
		else 
		{
			mot_fact = 0;
		}
		info->m_constraintError[srow] = mot_fact * targetvelocity * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableSpring)
	{
		btScalar error = limot->m_currentPosition - limot->m_equilibriumPoint;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);

		//btScalar cfm = 1.0 / ((1.0/info->fps)*limot->m_springStiffness+ limot->m_springDamping);
		//if(cfm > 0.99999)
		//	cfm = 0.99999;
		//btScalar erp = (1.0/info->fps)*limot->m_springStiffness / ((1.0/info->fps)*limot->m_springStiffness + limot->m_springDamping);
		//info->m_constraintError[srow] = info->fps * erp * error * (rotational ? -1.0 : 1.0);
		//info->m_lowerLimit[srow] = -SIMD_INFINITY;
		//info->m_upperLimit[srow] = SIMD_INFINITY;

		btScalar dt = BT_ONE / info->fps;
		btScalar kd = limot->m_springDamping;
		btScalar ks = limot->m_springStiffness;
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);
//		btScalar erp = 0.1;
		btScalar cfm = BT_ZERO;
		btScalar mA = BT_ONE / m_rbA.getInvMass();
		btScalar mB = BT_ONE / m_rbB.getInvMass();
		btScalar m = mA > mB ? mB : mA;
		btScalar angularfreq = sqrt(ks / m);


		//limit stiffness (the spring should not be sampled faster that the quarter of its angular frequency)
		if(limot->m_springStiffnessLimited && 0.25 < angularfreq * dt)
		{
			ks = BT_ONE / dt / dt / btScalar(16.0) * m;
		}
		//avoid damping that would blow up the spring
		if(limot->m_springDampingLimited && kd * dt > m)
		{
			kd = m / dt;
		}
		btScalar fs = ks * error * dt;
		btScalar fd = -kd * (vel) * (rotational ? -1 : 1) * dt;
		btScalar f = (fs+fd);

		info->m_constraintError[srow] = (vel + f * (rotational ? -1 : 1)) ;

		btScalar minf = f < fd ? f : fd;
		btScalar maxf = f < fd ? fd : f;
		if(!rotational)
		{
			info->m_lowerLimit[srow] = minf > 0 ? 0 : minf;
			info->m_upperLimit[srow] = maxf < 0 ? 0 : maxf;
		}
		else
		{
			info->m_lowerLimit[srow] = -maxf > 0 ? 0 : -maxf;
			info->m_upperLimit[srow] = -minf < 0 ? 0 : -minf;
		}

		info->cfm[srow] = cfm;
		srow += info->rowskip;
		++count;
	}

	return count;
}